

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefileCall::~cmMakefileCall(cmMakefileCall *this)

{
  cmListFileBacktrace local_20;
  cmMakefileCall *local_10;
  cmMakefileCall *this_local;
  
  local_10 = this;
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::pop_back
            (&this->Makefile->ExecutionStatusStack);
  this->Makefile->RecursionDepth = this->Makefile->RecursionDepth + -1;
  cmListFileBacktrace::Pop(&local_20);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_20);
  cmListFileBacktrace::~cmListFileBacktrace(&local_20);
  return;
}

Assistant:

~cmMakefileCall()
  {
    this->Makefile->ExecutionStatusStack.pop_back();
    --this->Makefile->RecursionDepth;
    this->Makefile->Backtrace = this->Makefile->Backtrace.Pop();
  }